

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O2

void __thiscall ImplSimd<SimdAVX>::YUV2RGB(ImplSimd<SimdAVX> *this,YUV420 *yuv,RGB *rgb)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined1 auVar13 [32];
  uint __line;
  char *__assertion;
  size_t i;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  
  if (yuv->height_ == rgb->height_) {
    if (yuv->width_ == rgb->width_) {
      uVar15 = yuv->size_;
      if ((uVar15 & 0xf) == 0) {
        puVar7 = yuv->y_;
        puVar8 = yuv->u_;
        puVar9 = yuv->v_;
        puVar10 = rgb->r_;
        puVar11 = rgb->g_;
        puVar12 = rgb->b_;
        auVar16._8_2_ = 0xff80;
        auVar16._0_8_ = 0xff80ff80ff80ff80;
        auVar16._10_2_ = 0xff80;
        auVar16._12_2_ = 0xff80;
        auVar16._14_2_ = 0xff80;
        auVar16._16_2_ = 0xff80;
        auVar16._18_2_ = 0xff80;
        auVar16._20_2_ = 0xff80;
        auVar16._22_2_ = 0xff80;
        auVar16._24_2_ = 0xff80;
        auVar16._26_2_ = 0xff80;
        auVar16._28_2_ = 0xff80;
        auVar16._30_2_ = 0xff80;
        auVar17._8_2_ = 0x12a;
        auVar17._0_8_ = 0x12a012a012a012a;
        auVar17._10_2_ = 0x12a;
        auVar17._12_2_ = 0x12a;
        auVar17._14_2_ = 0x12a;
        auVar17._16_2_ = 0x12a;
        auVar17._18_2_ = 0x12a;
        auVar17._20_2_ = 0x12a;
        auVar17._22_2_ = 0x12a;
        auVar17._24_2_ = 0x12a;
        auVar17._26_2_ = 0x12a;
        auVar17._28_2_ = 0x12a;
        auVar17._30_2_ = 0x12a;
        auVar18._8_2_ = 0x199;
        auVar18._0_8_ = 0x199019901990199;
        auVar18._10_2_ = 0x199;
        auVar18._12_2_ = 0x199;
        auVar18._14_2_ = 0x199;
        auVar18._16_2_ = 0x199;
        auVar18._18_2_ = 0x199;
        auVar18._20_2_ = 0x199;
        auVar18._22_2_ = 0x199;
        auVar18._24_2_ = 0x199;
        auVar18._26_2_ = 0x199;
        auVar18._28_2_ = 0x199;
        auVar18._30_2_ = 0x199;
        auVar19._8_2_ = 0xede0;
        auVar19._0_8_ = 0xede0ede0ede0ede0;
        auVar19._10_2_ = 0xede0;
        auVar19._12_2_ = 0xede0;
        auVar19._14_2_ = 0xede0;
        auVar19._16_2_ = 0xede0;
        auVar19._18_2_ = 0xede0;
        auVar19._20_2_ = 0xede0;
        auVar19._22_2_ = 0xede0;
        auVar19._24_2_ = 0xede0;
        auVar19._26_2_ = 0xede0;
        auVar19._28_2_ = 0xede0;
        auVar19._30_2_ = 0xede0;
        auVar20._8_2_ = 0xff9c;
        auVar20._0_8_ = 0xff9cff9cff9cff9c;
        auVar20._10_2_ = 0xff9c;
        auVar20._12_2_ = 0xff9c;
        auVar20._14_2_ = 0xff9c;
        auVar20._16_2_ = 0xff9c;
        auVar20._18_2_ = 0xff9c;
        auVar20._20_2_ = 0xff9c;
        auVar20._22_2_ = 0xff9c;
        auVar20._24_2_ = 0xff9c;
        auVar20._26_2_ = 0xff9c;
        auVar20._28_2_ = 0xff9c;
        auVar20._30_2_ = 0xff9c;
        auVar21._8_2_ = 0xff30;
        auVar21._0_8_ = 0xff30ff30ff30ff30;
        auVar21._10_2_ = 0xff30;
        auVar21._12_2_ = 0xff30;
        auVar21._14_2_ = 0xff30;
        auVar21._16_2_ = 0xff30;
        auVar21._18_2_ = 0xff30;
        auVar21._20_2_ = 0xff30;
        auVar21._22_2_ = 0xff30;
        auVar21._24_2_ = 0xff30;
        auVar21._26_2_ = 0xff30;
        auVar21._28_2_ = 0xff30;
        auVar21._30_2_ = 0xff30;
        auVar22._8_2_ = 0x204;
        auVar22._0_8_ = 0x204020402040204;
        auVar22._10_2_ = 0x204;
        auVar22._12_2_ = 0x204;
        auVar22._14_2_ = 0x204;
        auVar22._16_2_ = 0x204;
        auVar22._18_2_ = 0x204;
        auVar22._20_2_ = 0x204;
        auVar22._22_2_ = 0x204;
        auVar22._24_2_ = 0x204;
        auVar22._26_2_ = 0x204;
        auVar22._28_2_ = 0x204;
        auVar22._30_2_ = 0x204;
        for (uVar14 = 0; uVar14 < uVar15; uVar14 = uVar14 + 0x10) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(puVar7 + uVar14);
          auVar1 = vpmovzxbw_avx(auVar1);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(puVar7 + uVar14 + 8);
          auVar2 = vpmovzxbw_avx(auVar2);
          auVar23._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
          auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          auVar23 = vpmullw_avx2(auVar23,auVar17);
          auVar23 = vpaddw_avx2(auVar23,auVar19);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(puVar8 + uVar14);
          auVar1 = vpmovzxbw_avx(auVar3);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(puVar8 + uVar14 + 8);
          auVar2 = vpmovzxbw_avx(auVar4);
          auVar24._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
          auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          auVar24 = vpaddw_avx2(auVar24,auVar16);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(puVar9 + uVar14);
          auVar1 = vpmovzxbw_avx(auVar5);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(puVar9 + uVar14 + 8);
          auVar2 = vpmovzxbw_avx(auVar6);
          auVar25._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
          auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          auVar25 = vpaddw_avx2(auVar25,auVar16);
          auVar26 = vpmullw_avx2(auVar25,auVar18);
          auVar26 = vpaddw_avx2(auVar26,auVar23);
          auVar26 = vpsraw_avx2(auVar26,8);
          auVar1 = vpacksswb_avx(auVar26._0_16_,auVar26._16_16_);
          *(undefined1 (*) [16])(puVar10 + uVar14) = auVar1;
          auVar26 = vpmullw_avx2(auVar24,auVar20);
          auVar13 = vpmullw_avx2(auVar25,auVar21);
          auVar25 = vpaddw_avx2(auVar26,auVar23);
          auVar25 = vpaddw_avx2(auVar25,auVar13);
          auVar25 = vpsraw_avx2(auVar25,8);
          auVar1 = vpacksswb_avx(auVar25._0_16_,auVar25._16_16_);
          *(undefined1 (*) [16])(puVar11 + uVar14) = auVar1;
          auVar24 = vpmullw_avx2(auVar24,auVar22);
          auVar23 = vpaddw_avx2(auVar24,auVar23);
          auVar23 = vpsraw_avx2(auVar23,8);
          auVar1 = vpacksswb_avx(auVar23._0_16_,auVar23._16_16_);
          *(undefined1 (*) [16])(puVar12 + uVar14) = auVar1;
          uVar15 = yuv->size_;
        }
        return;
      }
      __assertion = "yuv->size_ % kStride == 0";
      __line = 0x21;
    }
    else {
      __assertion = "yuv->width_ == rgb->width_";
      __line = 0x20;
    }
  }
  else {
    __assertion = "yuv->height_ == rgb->height_";
    __line = 0x1f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,__line,"virtual void ImplSimd<SimdAVX>::YUV2RGB(YUV420 *, RGB *) [SIMD = SimdAVX]")
  ;
}

Assistant:

void ImplSimd<SIMD>::YUV2RGB(YUV420 *yuv, RGB *rgb) {
  assert(yuv->height_ == rgb->height_);
  assert(yuv->width_ == rgb->width_);
  assert(yuv->size_ % kStride == 0);

  auto y = yuv->y_;
  auto u = yuv->u_;
  auto v = yuv->v_;
  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  for(size_t i = 0; i < yuv->size_; i += kStride){
    Vector c = sub(load(y+i), cn(16));
    Vector d = sub(load(u+i), cn(128));
    Vector e = sub(load(v+i), cn(128));

    /*
    r[i] = clamp((298 * c + 409 * e + 128) >> 8);
    g[i] = clamp((298 * c - 100 * d - 208 * e + 128) >> 8);
    b[i] = clamp((298 * c + 516 * d + 128) >> 8);
     */
    store(rli(add(add(mul(cn(298),c),mul(cn(409),e)),cn(128)), 8), r + i);
    store(rli(add(sub(sub(mul(cn(298),c),mul(cn(100),d)),mul(cn(208),e)), cn(128)), 8), g + i);
    store(rli(add(add(mul(cn(298),c),mul(cn(516),d)),cn(128)), 8), b + i);
    SIMD::Empty();
  }
}